

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void callback_conv_result(CTState *cts,lua_State *L,TValue *o)

{
  TValue *pTVar1;
  long in_RSI;
  CTState *in_RDI;
  uint8_t *dp;
  CType *ctr;
  CType *ct;
  int local_98;
  uint local_94;
  CCallback *local_90;
  TValue *local_68;
  TValue *in_stack_ffffffffffffffc0;
  CTState *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  CTState *in_stack_ffffffffffffffd8;
  
  pTVar1 = (TValue *)(in_RDI->tab + (*(uint *)(*(long *)(in_RSI + 0x10) + -0xc) & 0xffff));
  while (local_68 = pTVar1, (local_68->u32).lo >> 0x1c == 8) {
    in_stack_ffffffffffffffd4 = (local_68->u32).lo & 0xffff;
    in_stack_ffffffffffffffc0 = local_68;
    in_stack_ffffffffffffffc8 = in_RDI;
    in_stack_ffffffffffffffd8 = in_RDI;
    pTVar1 = (TValue *)(in_RDI->tab + in_stack_ffffffffffffffd4);
  }
  if ((local_68->u32).lo >> 0x1c != 4) {
    local_90 = (CCallback *)(in_RDI->cb).gpr;
    if (((local_68->u32).lo & 0xf4000000) == 0x4000000) {
      local_90 = &in_RDI->cb;
    }
    lj_cconv_ct_tv(in_stack_ffffffffffffffd8,
                   (CType *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (uint8_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   (CTInfo)((ulong)in_RDI >> 0x20));
    if ((((local_68->u32).lo & 0xf4000000) == 0) && ((local_68->field_2).it < 4)) {
      if (((local_68->u32).lo & 0x800000) == 0) {
        if ((local_68->field_2).it == 1) {
          local_98 = (int)*(char *)local_90->fpr;
        }
        else {
          local_98 = (int)*(short *)local_90->fpr;
        }
        *(int *)local_90->fpr = local_98;
      }
      else {
        if ((local_68->field_2).it == 1) {
          local_94 = (uint)*(byte *)local_90->fpr;
        }
        else {
          local_94 = (uint)*(ushort *)local_90->fpr;
        }
        *(uint *)local_90->fpr = local_94;
      }
    }
  }
  return;
}

Assistant:

static void callback_conv_result(CTState *cts, lua_State *L, TValue *o)
{
  CType *ctr = ctype_raw(cts, (uint16_t)(L->base-2)->u32.hi);
#if LJ_TARGET_X86
  cts->cb.gpr[2] = 0;
#endif
  if (!ctype_isvoid(ctr->info)) {
    uint8_t *dp = (uint8_t *)&cts->cb.gpr[0];
#if CCALL_NUM_FPR
    if (ctype_isfp(ctr->info))
      dp = (uint8_t *)&cts->cb.fpr[0];
#endif
    lj_cconv_ct_tv(cts, ctr, dp, o, 0);
#ifdef CALLBACK_HANDLE_RET
    CALLBACK_HANDLE_RET
#endif
    /* Extend returned integers to (at least) 32 bits. */
    if (ctype_isinteger_or_bool(ctr->info) && ctr->size < 4) {
      if (ctr->info & CTF_UNSIGNED)
	*(uint32_t *)dp = ctr->size == 1 ? (uint32_t)*(uint8_t *)dp :
					   (uint32_t)*(uint16_t *)dp;
      else
	*(int32_t *)dp = ctr->size == 1 ? (int32_t)*(int8_t *)dp :
					  (int32_t)*(int16_t *)dp;
    }
#if LJ_TARGET_X86
    if (ctype_isfp(ctr->info))
      cts->cb.gpr[2] = ctr->size == sizeof(float) ? 1 : 2;
#endif
  }
}